

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSeparateArgumentsCommand.cxx
# Opt level: O0

bool __thiscall
cmSeparateArgumentsCommand::InitialPass
          (cmSeparateArgumentsCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  ostream *poVar5;
  char *pcVar6;
  reference pcVar7;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2e8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2e0;
  const_iterator si;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2d0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2c8;
  const_iterator vi;
  char *sep;
  string value_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vec;
  undefined1 local_278 [8];
  string value;
  char *def;
  string local_248;
  undefined1 local_228 [8];
  ostringstream e;
  uint local_ac;
  int local_a8;
  uint i;
  Doing doing;
  Mode mode;
  string command;
  string var;
  allocator local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_4_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmSeparateArgumentsCommand *this_local;
  
  local_28 = param_2;
  param_4_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"must be given at least one argument.",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local._7_1_ = 0;
  }
  else {
    std::__cxx11::string::string((string *)(command.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)&doing);
    i = 0;
    local_a8 = 1;
    for (local_ac = 0;
        sVar3 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)param_4_local), local_ac < sVar3; local_ac = local_ac + 1) {
      if (local_a8 == 1) {
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_4_local,(ulong)local_ac);
        std::__cxx11::string::operator=
                  ((string *)(command.field_2._M_local_buf + 8),(string *)pvVar4);
        local_a8 = 2;
      }
      else {
        if (local_a8 == 2) {
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)param_4_local,(ulong)local_ac);
          bVar2 = std::operator==(pvVar4,"UNIX_COMMAND");
          if (bVar2) {
            i = 1;
            local_a8 = 3;
            goto LAB_0054bf73;
          }
        }
        if (local_a8 == 2) {
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)param_4_local,(ulong)local_ac);
          bVar2 = std::operator==(pvVar4,"WINDOWS_COMMAND");
          if (bVar2) {
            i = 2;
            local_a8 = 3;
            goto LAB_0054bf73;
          }
        }
        if (local_a8 != 3) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
          poVar5 = std::operator<<((ostream *)local_228,"given unknown argument ");
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)param_4_local,(ulong)local_ac);
          std::operator<<(poVar5,(string *)pvVar4);
          std::__cxx11::ostringstream::str();
          cmCommand::SetError(&this->super_cmCommand,&local_248);
          std::__cxx11::string::~string((string *)&local_248);
          this_local._7_1_ = 0;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
          goto LAB_0054c2eb;
        }
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_4_local,(ulong)local_ac);
        std::__cxx11::string::operator=((string *)&doing,(string *)pvVar4);
        local_a8 = 0;
      }
LAB_0054bf73:
    }
    if (i == 0) {
      pcVar6 = cmMakefile::GetDefinition
                         ((this->super_cmCommand).Makefile,(string *)((long)&command.field_2 + 8));
      value.field_2._8_8_ = pcVar6;
      if (pcVar6 != (char *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_278,pcVar6,
                   (allocator *)
                   ((long)&vec.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&vec.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        cmsys::SystemTools::ReplaceString((string *)local_278," ",";");
        pcVar1 = (this->super_cmCommand).Makefile;
        pcVar6 = (char *)std::__cxx11::string::c_str();
        cmMakefile::AddDefinition(pcVar1,(string *)((long)&command.field_2 + 8),pcVar6);
        std::__cxx11::string::~string((string *)local_278);
      }
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&value_1.field_2 + 8));
      if (i == 1) {
        pcVar6 = (char *)std::__cxx11::string::c_str();
        cmSystemTools::ParseUnixCommandLine
                  (pcVar6,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)((long)&value_1.field_2 + 8));
      }
      else {
        pcVar6 = (char *)std::__cxx11::string::c_str();
        cmSystemTools::ParseWindowsCommandLine
                  (pcVar6,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)((long)&value_1.field_2 + 8));
      }
      std::__cxx11::string::string((string *)&sep);
      vi._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x93e5db;
      local_2d0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&value_1.field_2 + 8));
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_2c8,&local_2d0);
      while( true ) {
        si._M_current =
             (char *)std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)((long)&value_1.field_2 + 8));
        bVar2 = __gnu_cxx::operator!=
                          (&local_2c8,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&si);
        if (!bVar2) break;
        std::__cxx11::string::operator+=((string *)&sep,(char *)vi._M_current);
        vi._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x911dbc;
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator->(&local_2c8);
        local_2e0._M_current = (char *)std::__cxx11::string::begin();
        while( true ) {
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator->(&local_2c8);
          local_2e8._M_current = (char *)std::__cxx11::string::end();
          bVar2 = __gnu_cxx::operator!=(&local_2e0,&local_2e8);
          if (!bVar2) break;
          pcVar7 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_2e0);
          if (*pcVar7 == ';') {
            std::__cxx11::string::operator+=((string *)&sep,'\\');
          }
          pcVar7 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_2e0);
          std::__cxx11::string::operator+=((string *)&sep,*pcVar7);
          __gnu_cxx::
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&local_2e0);
        }
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_2c8);
      }
      pcVar1 = (this->super_cmCommand).Makefile;
      pcVar6 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddDefinition(pcVar1,(string *)((long)&command.field_2 + 8),pcVar6);
      std::__cxx11::string::~string((string *)&sep);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&value_1.field_2 + 8));
    }
    this_local._7_1_ = 1;
LAB_0054c2eb:
    std::__cxx11::string::~string((string *)&doing);
    std::__cxx11::string::~string((string *)(command.field_2._M_local_buf + 8));
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmSeparateArgumentsCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.empty())
    {
    this->SetError("must be given at least one argument.");
    return false;
    }

  std::string var;
  std::string command;
  enum Mode { ModeOld, ModeUnix, ModeWindows };
  Mode mode = ModeOld;
  enum Doing { DoingNone, DoingVariable, DoingMode, DoingCommand };
  Doing doing = DoingVariable;
  for(unsigned int i=0; i < args.size(); ++i)
    {
    if(doing == DoingVariable)
      {
      var = args[i];
      doing = DoingMode;
      }
    else if(doing == DoingMode && args[i] == "UNIX_COMMAND")
      {
      mode = ModeUnix;
      doing = DoingCommand;
      }
    else if(doing == DoingMode && args[i] == "WINDOWS_COMMAND")
      {
      mode = ModeWindows;
      doing = DoingCommand;
      }
    else if(doing == DoingCommand)
      {
      command = args[i];
      doing = DoingNone;
      }
    else
      {
      std::ostringstream e;
      e << "given unknown argument " << args[i];
      this->SetError(e.str());
      return false;
      }
    }

  if(mode == ModeOld)
    {
    // Original space-replacement version of command.
    if(const char* def = this->Makefile->GetDefinition(var))
      {
      std::string value = def;
      cmSystemTools::ReplaceString(value, " ", ";");
      this->Makefile->AddDefinition(var, value.c_str());
      }
    }
  else
    {
    // Parse the command line.
    std::vector<std::string> vec;
    if(mode == ModeUnix)
      {
      cmSystemTools::ParseUnixCommandLine(command.c_str(), vec);
      }
    else // if(mode == ModeWindows)
      {
      cmSystemTools::ParseWindowsCommandLine(command.c_str(), vec);
      }

    // Construct the result list value.
    std::string value;
    const char* sep = "";
    for(std::vector<std::string>::const_iterator vi = vec.begin();
        vi != vec.end(); ++vi)
      {
      // Separate from the previous argument.
      value += sep;
      sep = ";";

      // Preserve semicolons.
      for(std::string::const_iterator si = vi->begin();
          si != vi->end(); ++si)
        {
        if(*si == ';')
          {
          value += '\\';
          }
        value += *si;
        }
      }
    this->Makefile->AddDefinition(var, value.c_str());
    }

  return true;
}